

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

void __thiscall
SslTcpServerImpl::SetAlpnProtokollNames
          (SslTcpServerImpl *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vStrProtoNames)

{
  pointer pSVar1;
  SslServerContext *ctx;
  pointer this_00;
  
  pSVar1 = (this->m_SslCtx).
           super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_SslCtx).
                 super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pSVar1; this_00 = this_00 + 1
      ) {
    OpenSSLWrapper::SslServerContext::SetAlpnProtokollNames(this_00,vStrProtoNames);
  }
  return;
}

Assistant:

void SslTcpServerImpl::SetAlpnProtokollNames(const vector<string>& vStrProtoNames)
{
    for (auto& ctx : m_SslCtx)
        ctx.SetAlpnProtokollNames(vStrProtoNames);
}